

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>::operator()
          (bin_writer<3> *this,
          truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  wchar_t wVar4;
  wchar_t *pwVar5;
  size_t sVar6;
  long lVar7;
  wchar_t wVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  byte abStack_29 [9];
  char buffer [23];
  
  pwVar5 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
  sVar6 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
  wVar8 = it->blackhole_;
  iVar1 = *(int *)(this + 8);
  lVar7 = (long)iVar1;
  pbVar10 = abStack_29 + lVar7;
  uVar11 = *(ulong *)this;
  do {
    *pbVar10 = (byte)uVar11 & 7 | 0x30;
    pbVar10 = pbVar10 + -1;
    bVar3 = 7 < uVar11;
    uVar11 = uVar11 >> 3;
  } while (bVar3);
  if (0 < iVar1) {
    lVar9 = 0;
    do {
      wVar4 = (int)(char)abStack_29[lVar9 + 1];
      if (sVar6 + lVar9 < uVar2) {
        *pwVar5 = (int)(char)abStack_29[lVar9 + 1];
        pwVar5 = pwVar5 + 1;
        wVar4 = wVar8;
      }
      wVar8 = wVar4;
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
    sVar6 = sVar6 + lVar7;
  }
  (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar5;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<wchar_t_*>).count_ = sVar6;
  it->blackhole_ = wVar8;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }